

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O2

aiColor4D __thiscall
Assimp::MDLImporter::ReplaceTextureWithColor(MDLImporter *this,aiTexture *pcTexture)

{
  ushort uVar1;
  bool bVar2;
  aiTexel *paVar3;
  long lVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  aiColor4D aVar10;
  
  if (pcTexture == (aiTexture *)0x0) {
    __assert_fail("__null != pcTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x67,"aiColor4D Assimp::MDLImporter::ReplaceTextureWithColor(const aiTexture *)")
    ;
  }
  uVar5 = 0;
  uVar7 = 0x7fc00000;
  if ((pcTexture->mHeight != 0) && (uVar7 = 0x7fc00000, pcTexture->mWidth != 0)) {
    lVar4 = (ulong)(pcTexture->mWidth * pcTexture->mHeight) * 4;
    paVar3 = pcTexture->pcData;
    do {
      lVar4 = lVar4 + -4;
      if (lVar4 == 0) {
        paVar3 = pcTexture->pcData;
        uVar1._0_1_ = paVar3->g;
        uVar1._1_1_ = paVar3->r;
        auVar9._8_4_ = DAT_005eb7f0._8_4_;
        auVar9._12_4_ = DAT_005eb7f0._12_4_;
        auVar8._4_4_ = (float)(uVar1 & 0xff);
        auVar8._0_4_ = (float)(byte)uVar1._1_1_;
        auVar8._8_8_ = 0;
        auVar6._0_4_ = (float)paVar3->b;
        auVar6._4_4_ = (float)paVar3->a;
        auVar6._8_8_ = 0;
        auVar6 = divps(auVar6,_DAT_005eb7f0);
        uVar5 = auVar6._0_8_;
        auVar9._4_4_ = (int)DAT_005eb7f0;
        auVar9._0_4_ = DAT_005eb7f0._4_4_;
        auVar9 = divps(auVar8,auVar9);
        uVar7 = auVar9._0_8_;
        goto LAB_0043a87e;
      }
      bVar2 = aiTexel::operator!=(paVar3 + 1,paVar3);
      paVar3 = paVar3 + 1;
    } while (!bVar2);
    uVar7 = 0x7fc00000;
    uVar5 = 0;
  }
LAB_0043a87e:
  aVar10.b = (float)(int)uVar5;
  aVar10.a = (float)(int)((ulong)uVar5 >> 0x20);
  aVar10.r = (float)(int)uVar7;
  aVar10.g = (float)(int)((ulong)uVar7 >> 0x20);
  return aVar10;
}

Assistant:

aiColor4D MDLImporter::ReplaceTextureWithColor(const aiTexture* pcTexture)
{
    ai_assert(NULL != pcTexture);

    aiColor4D clrOut;
    clrOut.r = get_qnan();
    if (!pcTexture->mHeight || !pcTexture->mWidth)
        return clrOut;

    const unsigned int iNumPixels = pcTexture->mHeight*pcTexture->mWidth;
    const aiTexel* pcTexel = pcTexture->pcData+1;
    const aiTexel* const pcTexelEnd = &pcTexture->pcData[iNumPixels];

    while (pcTexel != pcTexelEnd)
    {
        if (*pcTexel != *(pcTexel-1))
        {
            pcTexel = NULL;
            break;
        }
        ++pcTexel;
    }
    if (pcTexel)
    {
        clrOut.r = pcTexture->pcData->r / 255.0f;
        clrOut.g = pcTexture->pcData->g / 255.0f;
        clrOut.b = pcTexture->pcData->b / 255.0f;
        clrOut.a = pcTexture->pcData->a / 255.0f;
    }
    return clrOut;
}